

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_types.c
# Opt level: O0

void * lyplg_type_print_simple
                 (ly_ctx *UNUSED_ctx,lyd_value *value,LY_VALUE_FORMAT UNUSED_format,
                 void *UNUSED_prefix_data,ly_bool *dynamic,size_t *value_len)

{
  size_t local_40;
  size_t *value_len_local;
  ly_bool *dynamic_local;
  void *UNUSED_prefix_data_local;
  LY_VALUE_FORMAT UNUSED_format_local;
  lyd_value *value_local;
  ly_ctx *UNUSED_ctx_local;
  
  if (dynamic != (ly_bool *)0x0) {
    *dynamic = '\0';
  }
  if (value_len != (size_t *)0x0) {
    if (value->_canonical == (char *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = strlen(value->_canonical);
    }
    *value_len = local_40;
  }
  return value->_canonical;
}

Assistant:

LIBYANG_API_DEF const void *
lyplg_type_print_simple(const struct ly_ctx *UNUSED(ctx), const struct lyd_value *value, LY_VALUE_FORMAT UNUSED(format),
        void *UNUSED(prefix_data), ly_bool *dynamic, size_t *value_len)
{
    if (dynamic) {
        *dynamic = 0;
    }
    if (value_len) {
        *value_len = ly_strlen(value->_canonical);
    }
    return value->_canonical;
}